

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O0

h2o_filecache_ref_t * h2o_filecache_open_file(h2o_filecache_t *cache,char *path,int oflag)

{
  long lVar1;
  khint_t iter_00;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  khiter_t purge_iter;
  h2o_filecache_ref_t *purge_ref;
  int local_2c;
  h2o_filecache_ref_t *phStack_28;
  int dummy;
  h2o_filecache_ref_t *ref;
  khiter_t iter;
  int oflag_local;
  char *path_local;
  h2o_filecache_t *cache_local;
  
  ref._4_4_ = oflag;
  _iter = path;
  path_local = (char *)cache;
  ref._0_4_ = kh_get_opencache_set(cache->hash,path);
  if ((khint_t)ref == **(khint_t **)path_local) {
    sVar3 = strlen(_iter);
    phStack_28 = (h2o_filecache_ref_t *)h2o_mem_alloc(sVar3 + 0x131);
    phStack_28->_refcnt = 1;
    (phStack_28->_lru).next = (st_h2o_linklist_t *)0x0;
    (phStack_28->_lru).prev = (st_h2o_linklist_t *)0x0;
    strcpy(phStack_28->_path,_iter);
    if (*(long *)(path_local + 0x18) != 0) {
      if ((ulong)*(uint *)(*(long *)path_local + 4) == *(ulong *)(path_local + 0x18)) {
        iter_00 = kh_get_opencache_set
                            (*(kh_opencache_set_t **)path_local,
                             (kh_cstr_t)(*(long *)(path_local + 0x10) + 0x120));
        if (iter_00 == **(khint_t **)path_local) {
          __assert_fail("purge_iter != kh_end(cache->hash)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
                        ,0x6c,
                        "h2o_filecache_ref_t *h2o_filecache_open_file(h2o_filecache_t *, const char *, int)"
                       );
        }
        release_from_cache((h2o_filecache_t *)path_local,iter_00);
      }
      phStack_28->_refcnt = phStack_28->_refcnt + 1;
      kh_put_opencache_set(*(kh_opencache_set_t **)path_local,phStack_28->_path,&local_2c);
      h2o_linklist_insert(*(h2o_linklist_t **)(path_local + 8),&phStack_28->_lru);
    }
    iVar2 = open(_iter,ref._4_4_);
    phStack_28->fd = iVar2;
    if ((iVar2 == -1) ||
       (iVar2 = fstat(phStack_28->fd,(stat *)&(phStack_28->field_3).field_0), iVar2 != 0)) {
      piVar4 = __errno_location();
      (phStack_28->field_3).open_err = *piVar4;
      if (phStack_28->fd != -1) {
        close(phStack_28->fd);
        phStack_28->fd = -1;
      }
    }
    else {
      *(undefined1 *)((long)&phStack_28->field_3 + 200) = 0;
      *(undefined8 *)((long)&phStack_28->field_3 + 0x108) = 0;
    }
  }
  else {
    lVar1 = *(long *)(*(long *)(*(long *)path_local + 0x18) + (ulong)(khint_t)ref * 8);
    phStack_28 = (h2o_filecache_ref_t *)(lVar1 + -0x130);
    *(long *)(lVar1 + -0x128) = *(long *)(lVar1 + -0x128) + 1;
  }
  if (phStack_28->fd == -1) {
    iVar2 = (phStack_28->field_3).open_err;
    piVar4 = __errno_location();
    *piVar4 = iVar2;
    h2o_filecache_close_file(phStack_28);
    phStack_28 = (h2o_filecache_ref_t *)0x0;
  }
  return phStack_28;
}

Assistant:

h2o_filecache_ref_t *h2o_filecache_open_file(h2o_filecache_t *cache, const char *path, int oflag)
{
    khiter_t iter = kh_get(opencache_set, cache->hash, path);
    h2o_filecache_ref_t *ref;
    int dummy;

    /* lookup cache, and return the one if found */
    if (iter != kh_end(cache->hash)) {
        ref = H2O_STRUCT_FROM_MEMBER(h2o_filecache_ref_t, _path, kh_key(cache->hash, iter));
        ++ref->_refcnt;
        goto Exit;
    }

    /* create a new cache entry */
    ref = h2o_mem_alloc(offsetof(h2o_filecache_ref_t, _path) + strlen(path) + 1);
    ref->_refcnt = 1;
    ref->_lru = (h2o_linklist_t){NULL};
    strcpy(ref->_path, path);

    /* if cache is used, then... */
    if (cache->capacity != 0) {
        /* purge one entry from LRU if cache is full */
        if (kh_size(cache->hash) == cache->capacity) {
            h2o_filecache_ref_t *purge_ref = H2O_STRUCT_FROM_MEMBER(h2o_filecache_ref_t, _lru, cache->lru.prev);
            khiter_t purge_iter = kh_get(opencache_set, cache->hash, purge_ref->_path);
            assert(purge_iter != kh_end(cache->hash));
            release_from_cache(cache, purge_iter);
        }
        /* assign the new entry */
        ++ref->_refcnt;
        kh_put(opencache_set, cache->hash, ref->_path, &dummy);
        h2o_linklist_insert(cache->lru.next, &ref->_lru);
    }

    /* open the file, or memoize the error */
    if ((ref->fd = open(path, oflag)) != -1 && fstat(ref->fd, &ref->st) == 0) {
        ref->_last_modified.str[0] = '\0';
        ref->_etag.len = 0;
    } else {
        ref->open_err = errno;
        if (ref->fd != -1) {
            close(ref->fd);
            ref->fd = -1;
        }
    }

Exit:
    /* if the cache entry retains an error, return it instead of the reference */
    if (ref->fd == -1) {
        errno = ref->open_err;
        h2o_filecache_close_file(ref);
        ref = NULL;
    }
    return ref;
}